

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

uint32_t find_switch_node(log_multi *b)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  ulong uVar4;
  
  pnVar1 = (b->nodes)._begin;
  uVar4 = 0;
  while( true ) {
    if (pnVar1[uVar4].internal != true) break;
    pnVar2 = pnVar1 + uVar4;
    pnVar3 = pnVar1 + uVar4;
    uVar4 = (ulong)pnVar2->left;
    if (pnVar1[pnVar3->right].min_count <= pnVar1[pnVar2->left].min_count) {
      uVar4 = (ulong)pnVar3->right;
    }
  }
  return (uint32_t)uVar4;
}

Assistant:

inline uint32_t find_switch_node(log_multi& b)
{
  uint32_t node = 0;
  while (b.nodes[node].internal)
    if (b.nodes[b.nodes[node].left].min_count < b.nodes[b.nodes[node].right].min_count)
      node = b.nodes[node].left;
    else
      node = b.nodes[node].right;
  return node;
}